

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

void duckdb::TimeToStringCast::FormatTwoDigits(char *ptr,int32_t value)

{
  char cVar1;
  
  if (value < 10) {
    *ptr = '0';
    cVar1 = (char)value + '0';
  }
  else {
    *ptr = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)value * 2];
    cVar1 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)(value * 2) + 1];
  }
  ptr[1] = cVar1;
  return;
}

Assistant:

static void FormatTwoDigits(char *ptr, int32_t value) {
		D_ASSERT(value >= 0 && value <= 99);
		if (value < 10) {
			ptr[0] = '0';
			ptr[1] = UnsafeNumericCast<char>('0' + value);
		} else {
			auto index = UnsafeNumericCast<unsigned>(value * 2);
			ptr[0] = duckdb_fmt::internal::data::digits[index];
			ptr[1] = duckdb_fmt::internal::data::digits[index + 1];
		}
	}